

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O2

array<float,_3>
pbrt::SampleSphericalTriangle(array<pbrt::Point3<float>,_3> *v,Point3f *p,Point2f *u,Float *pdf)

{
  Point3<float> *pPVar1;
  ulong uVar2;
  bool bVar3;
  Point2f *pPVar4;
  int iVar5;
  Tuple3<pbrt::Vector3,_float> *pTVar6;
  char *args;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  Float __x;
  Float FVar11;
  Float FVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar46 [56];
  undefined1 auVar26 [64];
  undefined1 auVar17 [16];
  undefined1 auVar27 [64];
  undefined1 auVar18 [16];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  float fVar49;
  undefined1 auVar50 [16];
  undefined1 auVar52 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar58 [60];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar51 [16];
  undefined1 auVar57 [64];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined8 uVar63;
  undefined8 uVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  Vector3<float> VVar68;
  Vector3<float> VVar69;
  Vector3<float> VVar70;
  array<float,_3> aVar71;
  initializer_list<float> v_00;
  float local_158;
  float fStack_154;
  float local_138;
  float local_128;
  int vb;
  float fStack_114;
  float local_110;
  float va;
  float fStack_104;
  float local_100;
  Tuple3<pbrt::Vector3,_float> local_f8;
  Tuple3<pbrt::Vector3,_float> local_e8;
  float local_dc;
  Tuple3<pbrt::Vector3,_float> local_d8;
  Tuple3<pbrt::Vector3,_float> local_c8;
  Tuple3<pbrt::Vector3,_float> local_b8;
  Tuple3<pbrt::Vector3,_float> local_a8;
  array<float,_3> local_98;
  undefined1 local_88 [16];
  Point2f *local_78;
  Point3<float> *local_70;
  Tuple3<pbrt::Vector3,_float> local_68;
  Tuple3<pbrt::Vector3,_float> local_58;
  Tuple3<pbrt::Vector3,_float> local_48;
  Tuple3<pbrt::Vector3,_float> local_3c;
  undefined1 auVar9 [16];
  undefined8 uVar45;
  undefined1 auVar47 [56];
  undefined1 auVar48 [56];
  
  auVar58 = in_ZMM1._4_60_;
  auVar46 = in_ZMM0._8_56_;
  if (pdf != (Float *)0x0) {
    *pdf = 0.0;
  }
  VVar68 = Point3<float>::operator-(v->values,p);
  fVar49 = VVar68.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar26._0_8_ = VVar68.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar26._8_56_ = auVar46;
  auVar17 = auVar26._0_16_;
  local_e8._0_8_ = vmovlps_avx(auVar17);
  auVar47 = auVar46;
  local_e8.z = fVar49;
  VVar69 = Point3<float>::operator-(v->values + 1,p);
  fVar13 = VVar69.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar27._0_8_ = VVar69.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar27._8_56_ = auVar47;
  pPVar1 = v->values + 2;
  auVar18 = auVar27._0_16_;
  local_f8._0_8_ = vmovlps_avx(auVar18);
  auVar48 = auVar47;
  local_f8.z = fVar13;
  VVar70 = Point3<float>::operator-(pPVar1,p);
  fVar15 = fStack_114;
  auVar53._0_4_ = VVar70.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar53._4_60_ = auVar58;
  auVar28._0_8_ = VVar70.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar28._8_56_ = auVar48;
  _vb = (ulong)(uint)fStack_114 << 0x20;
  auVar8 = auVar28._0_16_;
  local_a8._0_8_ = vmovlps_avx(auVar8);
  auVar9._0_4_ = VVar68.super_Tuple3<pbrt::Vector3,_float>.x *
                 VVar68.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar9._4_4_ = VVar68.super_Tuple3<pbrt::Vector3,_float>.y *
                 VVar68.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar9._8_4_ = auVar46._0_4_ * auVar46._0_4_;
  auVar9._12_4_ = auVar46._4_4_ * auVar46._4_4_;
  auVar9 = vmovshdup_avx(auVar9);
  auVar9 = vfmadd231ss_fma(auVar9,auVar17,auVar17);
  auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar49),ZEXT416((uint)fVar49));
  va = auVar9._0_4_;
  local_a8.z = auVar53._0_4_;
  if (auVar9._0_4_ <= 0.0) {
    args = "LengthSquared(a)";
    iVar5 = 0x2c;
  }
  else {
    _vb = (ulong)(uint)fVar15 << 0x20;
    auVar17._0_4_ =
         VVar69.super_Tuple3<pbrt::Vector3,_float>.x * VVar69.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar17._4_4_ =
         VVar69.super_Tuple3<pbrt::Vector3,_float>.y * VVar69.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar17._8_4_ = auVar47._0_4_ * auVar47._0_4_;
    auVar17._12_4_ = auVar47._4_4_ * auVar47._4_4_;
    auVar9 = vmovshdup_avx(auVar17);
    auVar9 = vfmadd231ss_fma(auVar9,auVar18,auVar18);
    auVar9 = vfmadd213ss_fma(ZEXT416((uint)fVar13),ZEXT416((uint)fVar13),auVar9);
    va = auVar9._0_4_;
    if (auVar9._0_4_ <= 0.0) {
      args = "LengthSquared(b)";
      iVar5 = 0x2d;
    }
    else {
      auVar18._0_4_ =
           VVar70.super_Tuple3<pbrt::Vector3,_float>.x * VVar70.super_Tuple3<pbrt::Vector3,_float>.x
      ;
      auVar18._4_4_ =
           VVar70.super_Tuple3<pbrt::Vector3,_float>.y * VVar70.super_Tuple3<pbrt::Vector3,_float>.y
      ;
      auVar18._8_4_ = auVar48._0_4_ * auVar48._0_4_;
      auVar18._12_4_ = auVar48._4_4_ * auVar48._4_4_;
      _vb = (ulong)(uint)fVar15 << 0x20;
      local_88._0_8_ = v->values + 1;
      auVar9 = vmovshdup_avx(auVar18);
      auVar9 = vfmadd231ss_fma(auVar9,auVar8,auVar8);
      auVar46 = ZEXT856(0);
      auVar9 = vfmadd213ss_fma(auVar53._0_16_,auVar53._0_16_,auVar9);
      auVar58 = ZEXT1260(auVar9._4_12_);
      va = auVar9._0_4_;
      local_78 = u;
      local_70 = pPVar1;
      if (0.0 < auVar9._0_4_) {
        VVar68 = Normalize<float>((Vector3<float> *)&local_e8);
        local_e8.z = VVar68.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar29._0_8_ = VVar68.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar29._8_56_ = auVar46;
        local_e8._0_8_ = vmovlps_avx(auVar29._0_16_);
        VVar68 = Normalize<float>((Vector3<float> *)&local_f8);
        local_f8.z = VVar68.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar30._0_8_ = VVar68.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar30._8_56_ = auVar46;
        local_f8._0_8_ = vmovlps_avx(auVar30._0_16_);
        VVar68 = Normalize<float>((Vector3<float> *)&local_a8);
        local_a8.z = VVar68.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar31._0_8_ = VVar68.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar31._8_56_ = auVar46;
        local_a8._0_8_ = vmovlps_avx(auVar31._0_16_);
        VVar68 = Cross<float>((Vector3<float> *)&local_e8,(Vector3<float> *)&local_f8);
        fVar15 = VVar68.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar32._0_8_ = VVar68.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar32._8_56_ = auVar46;
        auVar17 = auVar32._0_16_;
        _va = vmovlps_avx(auVar17);
        auVar47 = auVar46;
        local_100 = fVar15;
        VVar69 = Cross<float>((Vector3<float> *)&local_f8,(Vector3<float> *)&local_a8);
        fVar49 = VVar69.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar33._0_8_ = VVar69.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar33._8_56_ = auVar47;
        auVar18 = auVar33._0_16_;
        _vb = vmovlps_avx(auVar18);
        auVar48 = auVar47;
        local_110 = fVar49;
        VVar70 = Cross<float>((Vector3<float> *)&local_a8,(Vector3<float> *)&local_e8);
        auVar54._0_4_ = VVar70.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar54._4_60_ = auVar58;
        auVar34._0_8_ = VVar70.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar34._8_56_ = auVar48;
        auVar8 = auVar34._0_16_;
        local_b8._0_8_ = vmovlps_avx(auVar8);
        auVar51._0_4_ =
             VVar68.super_Tuple3<pbrt::Vector3,_float>.x *
             VVar68.super_Tuple3<pbrt::Vector3,_float>.x;
        auVar51._4_4_ =
             VVar68.super_Tuple3<pbrt::Vector3,_float>.y *
             VVar68.super_Tuple3<pbrt::Vector3,_float>.y;
        auVar51._8_4_ = auVar46._0_4_ * auVar46._0_4_;
        auVar51._12_4_ = auVar46._4_4_ * auVar46._4_4_;
        auVar9 = vmovshdup_avx(auVar51);
        auVar9 = vfmadd231ss_fma(auVar9,auVar17,auVar17);
        auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar15),ZEXT416((uint)fVar15));
        uVar64._0_4_ = 0.0;
        uVar64._4_4_ = 0.0;
        uVar45._0_4_ = 0.0;
        uVar45._4_4_ = 0.0;
        uVar63._0_4_ = 0.0;
        uVar63._4_4_ = 0.0;
        if ((auVar9._0_4_ != 0.0) || (fVar15 = 0.0, NAN(auVar9._0_4_))) {
          auVar59._0_4_ =
               VVar69.super_Tuple3<pbrt::Vector3,_float>.x *
               VVar69.super_Tuple3<pbrt::Vector3,_float>.x;
          auVar59._4_4_ =
               VVar69.super_Tuple3<pbrt::Vector3,_float>.y *
               VVar69.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar59._8_4_ = auVar47._0_4_ * auVar47._0_4_;
          auVar59._12_4_ = auVar47._4_4_ * auVar47._4_4_;
          auVar9 = vmovshdup_avx(auVar59);
          auVar9 = vfmadd231ss_fma(auVar9,auVar18,auVar18);
          auVar9 = vfmadd213ss_fma(ZEXT416((uint)fVar49),ZEXT416((uint)fVar49),auVar9);
          if ((auVar9._0_4_ != 0.0) || (uVar64 = uVar45, fVar15 = 0.0, NAN(auVar9._0_4_))) {
            auVar60._0_4_ =
                 VVar70.super_Tuple3<pbrt::Vector3,_float>.x *
                 VVar70.super_Tuple3<pbrt::Vector3,_float>.x;
            auVar60._4_4_ =
                 VVar70.super_Tuple3<pbrt::Vector3,_float>.y *
                 VVar70.super_Tuple3<pbrt::Vector3,_float>.y;
            auVar60._8_4_ = auVar48._0_4_ * auVar48._0_4_;
            auVar60._12_4_ = auVar48._4_4_ * auVar48._4_4_;
            auVar9 = vmovshdup_avx(auVar60);
            auVar9 = vfmadd231ss_fma(auVar9,auVar8,auVar8);
            auVar9 = vfmadd213ss_fma(auVar54._0_16_,auVar54._0_16_,auVar9);
            if ((auVar9._0_4_ != 0.0) || (uVar64 = uVar63, fVar15 = 0.0, NAN(auVar9._0_4_))) {
              local_b8.z = auVar54._0_4_;
              VVar68 = Normalize<float>((Vector3<float> *)&va);
              local_100 = VVar68.super_Tuple3<pbrt::Vector3,_float>.z;
              auVar35._0_8_ = VVar68.super_Tuple3<pbrt::Vector3,_float>._0_8_;
              auVar35._8_56_ = auVar48;
              _va = vmovlps_avx(auVar35._0_16_);
              VVar68 = Normalize<float>((Vector3<float> *)&vb);
              local_110 = VVar68.super_Tuple3<pbrt::Vector3,_float>.z;
              auVar36._0_8_ = VVar68.super_Tuple3<pbrt::Vector3,_float>._0_8_;
              auVar36._8_56_ = auVar48;
              _vb = vmovlps_avx(auVar36._0_16_);
              VVar68 = Normalize<float>((Vector3<float> *)&local_b8);
              local_b8.z = VVar68.super_Tuple3<pbrt::Vector3,_float>.z;
              auVar37._0_8_ = VVar68.super_Tuple3<pbrt::Vector3,_float>._0_8_;
              auVar37._8_56_ = auVar48;
              local_b8._0_8_ = vmovlps_avx(auVar37._0_16_);
              auVar8._0_8_ = auVar37._0_8_ ^ 0x8000000080000000;
              auVar8._8_4_ = auVar48._0_4_ ^ 0x80000000;
              auVar8._12_4_ = auVar48._4_4_ ^ 0x80000000;
              local_c8.z = -local_b8.z;
              local_c8._0_8_ = vmovlps_avx(auVar8);
              __x = AngleBetween<float>((Vector3<float> *)&va,(Vector3<float> *)&local_c8);
              auVar19._0_8_ = _va ^ 0x8000000080000000;
              auVar19._8_4_ = 0x80000000;
              auVar19._12_4_ = 0x80000000;
              local_c8.z = -local_100;
              local_c8._0_8_ = vmovlps_avx(auVar19);
              FVar11 = AngleBetween<float>((Vector3<float> *)&vb,(Vector3<float> *)&local_c8);
              auVar20._0_8_ = _vb ^ 0x8000000080000000;
              auVar20._8_4_ = 0x80000000;
              auVar20._12_4_ = 0x80000000;
              local_c8.z = -local_110;
              local_c8._0_8_ = vmovlps_avx(auVar20);
              FVar12 = AngleBetween<float>((Vector3<float> *)&local_b8,(Vector3<float> *)&local_c8);
              pPVar4 = local_78;
              uVar64._0_4_ = 0.0;
              uVar64._4_4_ = 0.0;
              fVar49 = __x + FVar11 + FVar12 + -3.1415927;
              fVar15 = 0.0;
              if (0.0 < fVar49) {
                if (pdf != (Float *)0x0) {
                  *pdf = 1.0 / fVar49;
                }
                fVar49 = fVar49 * (local_78->super_Tuple2<pbrt::Point2,_float>).x;
                fVar13 = cosf(__x);
                fVar14 = sinf(__x);
                fVar15 = sinf(fVar49);
                fVar16 = cosf(fVar49);
                auVar9 = vfmsub231ss_fma(ZEXT416((uint)(fVar16 * fVar14)),ZEXT416((uint)fVar15),
                                         ZEXT416((uint)fVar13));
                fVar16 = auVar9._0_4_;
                local_dc = cosf(fVar49);
                fVar15 = sinf(fVar49);
                pPVar1 = local_70;
                uVar64 = local_e8._0_8_;
                auVar66._8_8_ = 0;
                auVar66._0_4_ = local_e8.x;
                auVar66._4_4_ = local_e8.y;
                auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar14 * fVar15)),ZEXT416((uint)fVar13),
                                          ZEXT416((uint)local_dc));
                fVar15 = auVar17._0_4_ - fVar13;
                auVar9 = vmovshdup_avx(auVar66);
                auVar9 = vfmadd231ss_fma(ZEXT416((uint)(auVar9._0_4_ * local_f8.y)),auVar66,
                                         ZEXT416((uint)local_f8.x));
                auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)local_e8.z),ZEXT416((uint)local_f8.z))
                ;
                auVar9 = vfmadd213ss_fma(auVar9,ZEXT416((uint)fVar14),ZEXT416((uint)fVar16));
                auVar18 = vfmsub231ss_fma(ZEXT416((uint)(fVar16 * fVar15)),auVar9,auVar17);
                auVar17 = vfmadd231ss_fma(ZEXT416((uint)(auVar17._0_4_ * fVar15)),
                                          ZEXT416((uint)fVar16),auVar9);
                auVar9 = vfmsub213ss_fma(auVar18,ZEXT416((uint)fVar13),auVar9);
                auVar50._0_4_ = auVar9._0_4_ / (fVar14 * auVar17._0_4_);
                auVar50._4_12_ = auVar9._4_12_;
                if (NAN(auVar50._0_4_)) {
                  LogFatal<char_const(&)[17]>
                            (Fatal,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling.cpp"
                             ,0x55,"Check failed: %s",(char (*) [17])"!IsNaN(cosBetap)");
                }
                auVar9 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar50);
                uVar45 = vcmpss_avx512f(auVar50,SUB6416(ZEXT464(0xbf800000),0),1);
                bVar3 = (bool)((byte)uVar45 & 1);
                auVar7._4_12_ = auVar9._4_12_;
                auVar7._0_4_ = (float)((uint)bVar3 * -0x40800000 + (uint)!bVar3 * auVar9._0_4_);
                fVar15 = local_e8.z * auVar7._0_4_;
                auVar9 = vfnmadd213ss_fma(auVar7,auVar7,SUB6416(ZEXT464(0x3f800000),0));
                auVar9 = vmaxss_avx(auVar9,ZEXT816(0) << 0x20);
                auVar9 = vsqrtss_avx(auVar9,auVar9);
                auVar46 = ZEXT856(auVar9._8_8_);
                VVar68 = GramSchmidt<float>((Vector3<float> *)&local_a8,(Vector3<float> *)&local_e8)
                ;
                uVar45 = auVar46._0_8_;
                local_d8.z = VVar68.super_Tuple3<pbrt::Vector3,_float>.z;
                auVar38._0_8_ = VVar68.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                auVar38._8_56_ = auVar46;
                local_d8._0_8_ = vmovlps_avx(auVar38._0_16_);
                VVar68 = Normalize<float>((Vector3<float> *)&local_d8);
                local_128 = auVar9._0_4_;
                local_158 = (float)uVar64;
                fStack_154 = SUB84(uVar64,4);
                local_c8.z = local_128 * VVar68.super_Tuple3<pbrt::Vector3,_float>.z + fVar15;
                auVar65._8_8_ = 0;
                auVar65._0_4_ = local_f8.x;
                auVar65._4_4_ = local_f8.y;
                auVar21._0_4_ =
                     auVar7._0_4_ * local_158 +
                     local_128 * VVar68.super_Tuple3<pbrt::Vector3,_float>.x;
                auVar21._4_4_ =
                     auVar7._0_4_ * fStack_154 +
                     local_128 * VVar68.super_Tuple3<pbrt::Vector3,_float>.y;
                auVar21._8_4_ = auVar7._0_4_ * 0.0 + local_128 * (float)uVar45;
                auVar21._12_4_ = auVar7._0_4_ * 0.0 + local_128 * (float)((ulong)uVar45 >> 0x20);
                local_c8._0_8_ = vmovlps_avx(auVar21);
                auVar67._0_4_ = auVar21._0_4_ * local_f8.x;
                auVar67._4_4_ = auVar21._4_4_ * local_f8.y;
                auVar67._8_4_ = auVar21._8_4_ * 0.0;
                auVar67._12_4_ = auVar21._12_4_ * 0.0;
                auVar9 = vmovshdup_avx(auVar67);
                auVar9 = vfmadd231ss_fma(auVar9,auVar65,auVar21);
                auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)local_f8.z),ZEXT416((uint)local_c8.z))
                ;
                auVar9 = vfnmadd132ss_fma(ZEXT416((uint)(1.0 - auVar9._0_4_)),
                                          SUB6416(ZEXT464(0x3f800000),0),
                                          ZEXT416((uint)(pPVar4->super_Tuple2<pbrt::Point2,_float>).
                                                        y));
                fVar49 = auVar9._0_4_;
                fVar15 = local_f8.z * fVar49;
                auVar9 = vfnmadd213ss_fma(auVar9,auVar9,SUB6416(ZEXT464(0x3f800000),0));
                auVar9 = vmaxss_avx(auVar9,ZEXT416(0));
                auVar9 = vsqrtss_avx(auVar9,auVar9);
                auVar22._0_4_ = local_f8.x * fVar49;
                auVar22._4_4_ = local_f8.y * fVar49;
                auVar22._8_4_ = fVar49 * 0.0;
                auVar22._12_4_ = fVar49 * 0.0;
                auVar46 = ZEXT856(auVar22._8_8_);
                VVar68 = GramSchmidt<float>((Vector3<float> *)&local_c8,(Vector3<float> *)&local_f8)
                ;
                uVar64 = auVar46._0_8_;
                local_58.z = VVar68.super_Tuple3<pbrt::Vector3,_float>.z;
                auVar39._0_8_ = VVar68.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                auVar39._8_56_ = auVar46;
                local_58._0_8_ = vmovlps_avx(auVar39._0_16_);
                VVar68 = Normalize<float>((Vector3<float> *)&local_58);
                local_138 = auVar9._0_4_;
                local_d8.z = VVar68.super_Tuple3<pbrt::Vector3,_float>.z * local_138 + fVar15;
                auVar58 = (undefined1  [60])0x0;
                auVar23._0_4_ =
                     VVar68.super_Tuple3<pbrt::Vector3,_float>.x * local_138 + auVar22._0_4_;
                auVar23._4_4_ =
                     VVar68.super_Tuple3<pbrt::Vector3,_float>.y * local_138 + auVar22._4_4_;
                auVar23._8_4_ = (float)uVar64 * local_138 + auVar22._8_4_;
                auVar23._12_4_ = (float)((ulong)uVar64 >> 0x20) * local_138 + auVar22._12_4_;
                auVar47 = ZEXT856(auVar23._8_8_);
                local_d8._0_8_ = vmovlps_avx(auVar23);
                VVar68 = Point3<float>::operator-((Point3<float> *)local_88._0_8_,v->values);
                auVar40._0_8_ = VVar68.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                auVar40._8_56_ = auVar47;
                local_58._0_8_ = vmovlps_avx(auVar40._0_16_);
                auVar46 = auVar47;
                local_58.z = VVar68.super_Tuple3<pbrt::Vector3,_float>.z;
                VVar69 = Point3<float>::operator-(pPVar1,v->values);
                local_48.z = VVar69.super_Tuple3<pbrt::Vector3,_float>.z;
                auVar41._0_8_ = VVar69.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                auVar41._8_56_ = auVar46;
                local_48._0_8_ = vmovlps_avx(auVar41._0_16_);
                VVar69 = Cross<float>((Vector3<float> *)&local_d8,(Vector3<float> *)&local_48);
                auVar55._0_4_ = VVar69.super_Tuple3<pbrt::Vector3,_float>.z;
                auVar55._4_60_ = auVar58;
                auVar42._0_8_ = VVar69.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                auVar42._8_56_ = auVar46;
                auVar9 = auVar42._0_16_;
                if (SampleSphericalTriangle(pstd::array<pbrt::Point3<float>,int>const&,pbrt::Point3<float>const&,pbrt::Point2<float>const&,float*)
                    ::reg == '\0') {
                  iVar5 = __cxa_guard_acquire(&SampleSphericalTriangle(pstd::array<pbrt::Point3<float>,int>const&,pbrt::Point3<float>const&,pbrt::Point2<float>const&,float*)
                                               ::reg);
                  if (iVar5 != 0) {
                    StatRegisterer::StatRegisterer
                              ((StatRegisterer *)
                               &SampleSphericalTriangle(pstd::array<pbrt::Point3<float>,int>const&,pbrt::Point3<float>const&,pbrt::Point2<float>const&,float*)
                                ::reg,SampleSphericalTriangle(pstd::array<pbrt::
                                      Point3<float>,3>const&,pbrt::Point3<float>const&,pbrt::
                                      Point2<float>const&,float*)::$_0::__invoke(pbrt::
                                      StatsAccumulator__,(PixelAccumFunc)0x0);
                    __cxa_guard_release(&SampleSphericalTriangle(pstd::array<pbrt::Point3<float>,int>const&,pbrt::Point3<float>const&,pbrt::Point2<float>const&,float*)
                                         ::reg);
                  }
                }
                *(long *)(in_FS_OFFSET + -0x2e0) = *(long *)(in_FS_OFFSET + -0x2e0) + 1;
                auVar61._0_4_ =
                     VVar69.super_Tuple3<pbrt::Vector3,_float>.x *
                     VVar68.super_Tuple3<pbrt::Vector3,_float>.x;
                auVar61._4_4_ =
                     VVar69.super_Tuple3<pbrt::Vector3,_float>.y *
                     VVar68.super_Tuple3<pbrt::Vector3,_float>.y;
                auVar61._8_4_ = auVar46._0_4_ * auVar47._0_4_;
                auVar61._12_4_ = auVar46._4_4_ * auVar47._4_4_;
                auVar17 = vmovshdup_avx(auVar61);
                auVar17 = vfmadd231ss_fma(auVar17,auVar9,auVar40._0_16_);
                auVar17 = vfmadd213ss_fma(ZEXT416((uint)VVar68.super_Tuple3<pbrt::Vector3,_float>.z)
                                          ,auVar55._0_16_,auVar17);
                fVar15 = auVar17._0_4_;
                if ((fVar15 != 0.0) || (NAN(fVar15))) {
                  auVar58 = ZEXT1260(auVar42._4_12_);
                  fVar15 = 1.0 / fVar15;
                  auVar46 = ZEXT856(0);
                  VVar68 = Point3<float>::operator-(p,v->values);
                  auVar56._0_4_ = VVar68.super_Tuple3<pbrt::Vector3,_float>.z;
                  auVar56._4_60_ = auVar58;
                  auVar43._0_8_ = VVar68.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                  auVar43._8_56_ = auVar46;
                  local_88 = auVar43._0_16_;
                  auVar51 = auVar56._0_16_;
                  local_68._0_8_ = vmovlps_avx(local_88);
                  local_68.z = auVar56._0_4_;
                  VVar68 = Cross<float>((Vector3<float> *)&local_68,(Vector3<float> *)&local_58);
                  auVar57._4_60_ = auVar56._4_60_;
                  auVar57._0_4_ = VVar68.super_Tuple3<pbrt::Vector3,_float>.z;
                  auVar44._0_8_ = VVar68.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                  auVar44._8_56_ = auVar46;
                  pTVar6 = &local_3c;
                  auVar8 = vpermi2ps_avx512vl(_DAT_004312c0,auVar9,ZEXT416((uint)local_d8.y));
                  auVar17 = vinsertps_avx(auVar44._0_16_,local_88,0x4c);
                  auVar18 = vinsertps_avx(local_88,auVar44._0_16_,0x1c);
                  auVar62._0_4_ = auVar8._0_4_ * auVar17._0_4_;
                  auVar62._4_4_ = auVar8._4_4_ * auVar17._4_4_;
                  auVar62._8_4_ = auVar8._8_4_ * auVar17._8_4_;
                  auVar62._12_4_ = auVar8._12_4_ * auVar17._12_4_;
                  auVar9 = vinsertps_avx(auVar9,ZEXT416((uint)local_d8.x),0x10);
                  auVar18 = vfmadd213ps_fma(auVar9,auVar18,auVar62);
                  auVar9 = vinsertps_avx(auVar51,auVar57._0_16_,0x10);
                  auVar17 = vinsertps_avx(auVar55._0_16_,ZEXT416((uint)local_d8.z),0x10);
                  auVar9 = vfmadd213ps_fma(auVar17,auVar9,auVar18);
                  auVar25._0_4_ = fVar15 * auVar9._0_4_;
                  auVar25._4_4_ = fVar15 * auVar9._4_4_;
                  auVar25._8_4_ = fVar15 * auVar9._8_4_;
                  auVar25._12_4_ = fVar15 * auVar9._12_4_;
                  uVar2 = vcmpps_avx512vl(auVar25,ZEXT816(0) << 0x20,5);
                  auVar52._8_4_ = 0x3f800000;
                  auVar52._0_8_ = 0x3f8000003f800000;
                  auVar52._12_4_ = 0x3f800000;
                  auVar9 = vminps_avx512vl(auVar52,auVar25);
                  fVar15 = (float)((uint)((byte)uVar2 & 1) * auVar9._0_4_);
                  auVar10._4_4_ = (uint)((byte)(uVar2 >> 1) & 1) * auVar9._4_4_;
                  auVar10._0_4_ = fVar15;
                  auVar10._8_4_ = (uint)((byte)(uVar2 >> 2) & 1) * auVar9._8_4_;
                  auVar10._12_4_ = (uint)((byte)(uVar2 >> 3) & 1) * auVar9._12_4_;
                  auVar9 = vmovshdup_avx(auVar10);
                  fVar49 = auVar9._0_4_;
                  fVar13 = fVar15 / (fVar15 + fVar49);
                  bVar3 = 1.0 < fVar15 + fVar49;
                  local_3c.z = (float)((uint)bVar3 * (int)(fVar49 / (fVar49 + fVar13)) +
                                      (uint)!bVar3 * (int)fVar49);
                  local_3c.y = (float)((uint)bVar3 * (int)fVar13 + (uint)!bVar3 * (int)fVar15);
                  local_3c.x = (1.0 - local_3c.y) - local_3c.z;
                }
                else {
                  auVar24._8_4_ = 0x3eaaaaab;
                  auVar24._0_8_ = 0x3eaaaaab3eaaaaab;
                  auVar24._12_4_ = 0x3eaaaaab;
                  *(long *)(in_FS_OFFSET + -0x2e8) = *(long *)(in_FS_OFFSET + -0x2e8) + 1;
                  pTVar6 = &local_68;
                  local_68._0_8_ = vmovlps_avx(auVar24);
                  local_68.z = 0.33333334;
                }
                v_00._M_len = 3;
                v_00._M_array = &pTVar6->x;
                pstd::array<float,_3>::array(&local_98,v_00);
                uVar64 = local_98.values._0_8_;
                fVar15 = local_98.values[2];
              }
            }
          }
        }
        aVar71.values[2] = fVar15;
        aVar71.values[0] = (float)uVar64;
        aVar71.values[1] = SUB84(uVar64,4);
        return (array<float,_3>)aVar71.values;
      }
      args = "LengthSquared(c)";
      iVar5 = 0x2e;
    }
  }
  LogFatal<char_const(&)[17],char_const(&)[2],char_const(&)[17],float&,char_const(&)[2],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling.cpp"
             ,iVar5,"Check failed: %s > %s with %s = %s, %s = %s",(char (*) [17])args,
             (char (*) [2])0x2cf1ae5,(char (*) [17])args,&va,(char (*) [2])0x2cf1ae5,&vb);
}

Assistant:

pstd::array<Float, 3> SampleSphericalTriangle(const pstd::array<Point3f, 3> &v,
                                              const Point3f &p, const Point2f &u,
                                              Float *pdf) {
    if (pdf != nullptr)
        *pdf = 0;
    // Compute vectors _a_, _b_, and _c_ to spherical triangle vertices
    Vector3f a(v[0] - p), b(v[1] - p), c(v[2] - p);
    CHECK_GT(LengthSquared(a), 0);
    CHECK_GT(LengthSquared(b), 0);
    CHECK_GT(LengthSquared(c), 0);
    a = Normalize(a);
    b = Normalize(b);
    c = Normalize(c);

    // Compute normalized cross products of all direction pairs
    Vector3f n_ab = Cross(a, b), n_bc = Cross(b, c), n_ca = Cross(c, a);
    if (LengthSquared(n_ab) == 0 || LengthSquared(n_bc) == 0 || LengthSquared(n_ca) == 0)
        return {};
    n_ab = Normalize(n_ab);
    n_bc = Normalize(n_bc);
    n_ca = Normalize(n_ca);

    // Compute angles $\alpha$, $\beta$, and $\gamma$ at spherical triangle vertices
    Float alpha = AngleBetween(n_ab, -n_ca);
    Float beta = AngleBetween(n_bc, -n_ab);
    Float gamma = AngleBetween(n_ca, -n_bc);

    // Uniformly sample triangle area $A$ to compute $A'$
    Float A = alpha + beta + gamma - Pi;
    if (A <= 0)
        return {};
    if (pdf != nullptr)
        *pdf = 1 / A;
    Float Ap = u[0] * A;

    // Compute $\sin \beta'$ and $\cos \beta'$ for point along _b_ for sampled area
    Float cosAlpha = std::cos(alpha), sinAlpha = std::sin(alpha);

    Float sinPhi = std::sin(Ap) * cosAlpha - std::cos(Ap) * sinAlpha;
    Float cosPhi = std::cos(Ap) * cosAlpha + std::sin(Ap) * sinAlpha;

    Float uu = cosPhi - cosAlpha;
    Float vv = sinPhi + sinAlpha * Dot(a, b) /* cos c */;
    Float cosBetap = (((vv * cosPhi - uu * sinPhi) * cosAlpha - vv) /
                      ((vv * sinPhi + uu * cosPhi) * sinAlpha));
    // Happens if the triangle basically covers the entire hemisphere.
    // We currently depend on calling code to detect this case, which
    // is sort of ugly/unfortunate.
    CHECK(!IsNaN(cosBetap));
    cosBetap = Clamp(cosBetap, -1, 1);
    Float sinBetap = SafeSqrt(1 - cosBetap * cosBetap);

    // Compute $c'$ along the arc between $b'$ and $a$
    Vector3f cp = cosBetap * a + sinBetap * Normalize(GramSchmidt(c, a));

    // Compute sampled spherical triangle direction and return barycentrics
    Float cosTheta = 1 - u[1] * (1 - Dot(cp, b));
    Float sinTheta = SafeSqrt(1 - cosTheta * cosTheta);
    Vector3f w = cosTheta * b + sinTheta * Normalize(GramSchmidt(cp, b));
    // Find barycentric coordinates for sampled direction _w_
    Vector3f e1(v[1] - v[0]), e2(v[2] - v[0]);
    Vector3f s1 = Cross(w, e2);
    Float divisor = Dot(s1, e1);
    CHECK_RARE(1e-6, divisor == 0);
    if (divisor == 0) {
        // This happens with triangles that cover (nearly) the whole
        // hemisphere.
        return {1.f / 3.f, 1.f / 3.f, 1.f / 3.f};
    }
    Float invDivisor = 1 / divisor;
    Vector3f s(p - v[0]);
    Float b1 = Dot(s, s1) * invDivisor;
    Vector3f s2 = Cross(s, e1);
    Float b2 = Dot(w, s2) * invDivisor;

    // Return clamped barycentrics for sampled direction
    b1 = Clamp(b1, 0, 1);
    b2 = Clamp(b2, 0, 1);
    if (b1 + b2 > 1) {
        b1 /= b1 + b2;
        b2 /= b1 + b2;
    }
    return {Float(1 - b1 - b2), Float(b1), Float(b2)};
}